

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall miniros::Timer::Timer(Timer *this,TimerOptions *ops)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  function<void_(const_miniros::TimerEvent_&)> *in_RSI;
  Impl *in_stack_ffffffffffffff98;
  Impl *in_stack_ffffffffffffffa0;
  shared_ptr<const_void> *__a;
  function<void_(const_miniros::TimerEvent_&)> *__x;
  function<void_(const_miniros::TimerEvent_&)> *this_00;
  
  operator_new(0x50);
  Impl::Impl(in_stack_ffffffffffffffa0);
  std::shared_ptr<miniros::Timer::Impl>::shared_ptr<miniros::Timer::Impl,void>
            ((shared_ptr<miniros::Timer::Impl> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
            );
  __x = in_RSI;
  peVar3 = std::__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4e8b4c);
  (peVar3->period_).super_DurationBase<miniros::Duration> =
       *(DurationBase<miniros::Duration> *)&(__x->super__Function_base)._M_functor;
  this_00 = (function<void_(const_miniros::TimerEvent_&)> *)
            ((long)&(in_RSI->super__Function_base)._M_functor + 8);
  std::__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4e8b70);
  std::function<void_(const_miniros::TimerEvent_&)>::operator=(this_00,__x);
  __a = *(shared_ptr<const_void> **)((long)&in_RSI[1].super__Function_base._M_functor + 8);
  peVar3 = std::__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4e8b9b);
  peVar3->callback_queue_ = (CallbackQueueInterface *)__a;
  std::__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4e8bbc);
  std::weak_ptr<void_const>::operator=
            ((weak_ptr<const_void> *)__a,(shared_ptr<const_void> *)in_stack_ffffffffffffff98);
  bVar2 = std::operator!=(__a,in_stack_ffffffffffffff98);
  peVar3 = std::__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4e8bed);
  peVar3->has_tracked_object_ = bVar2;
  bVar1 = in_RSI[2].super__Function_base._M_functor._M_pod_data[0];
  peVar3 = std::__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4e8c0d);
  peVar3->oneshot_ = (bool)(bVar1 & 1);
  return;
}

Assistant:

Timer::Timer(const TimerOptions& ops)
: impl_(new Impl)
{
  impl_->period_ = ops.period;
  impl_->callback_ = ops.callback;
  impl_->callback_queue_ = ops.callback_queue;
  impl_->tracked_object_ = ops.tracked_object;
  impl_->has_tracked_object_ = (ops.tracked_object != NULL);
  impl_->oneshot_ = ops.oneshot;
}